

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_image_t * decoder_get_frame(aom_codec_alg_priv_t *ctx,aom_codec_iter_t *iter)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  size_t *in_RSI;
  long in_RDI;
  aom_image_t *res;
  int plane_1;
  int is_hbd;
  int ssx;
  int mi_col;
  int tile_col;
  int tile_height_1;
  int tile_width_1;
  int plane;
  int ssy;
  int mi_row;
  int tile_row;
  int tile_height;
  int tile_width;
  int num_planes;
  RefCntBuffer *output_frame_buf;
  aom_film_grain_t *grain_params;
  YV12_BUFFER_CONFIG *sd;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  AVxWorkerInterface *winterface;
  uintptr_t *index;
  aom_image_t *img;
  AV1Decoder *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b8;
  int local_b4;
  int local_a8;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_7c;
  int local_78;
  int local_74;
  RefCntBuffer *local_70;
  aom_film_grain_t *local_68;
  YV12_BUFFER_CONFIG *local_60;
  CommonTileParams *local_58;
  AV1_COMMON *local_50;
  AV1Decoder *local_48;
  long *local_40;
  AVxWorker *local_38;
  AVxWorkerInterface *local_30;
  size_t *local_28;
  long local_20;
  long local_10;
  aom_image_t *local_8;
  
  local_20 = 0;
  if (in_RSI == (size_t *)0x0) {
    local_8 = (aom_image_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x69f0) == 0) {
    local_8 = (aom_image_t *)0x0;
  }
  else {
    local_28 = in_RSI;
    local_10 = in_RDI;
    local_30 = aom_get_worker_interface();
    local_38 = *(AVxWorker **)(local_10 + 0x69f0);
    local_40 = (long *)local_38->data1;
    local_48 = (AV1Decoder *)*local_40;
    (local_48->error).error_code = AOM_CODEC_OK;
    (local_48->error).has_detail = 0;
    local_50 = &local_48->common;
    local_58 = &(local_48->common).tiles;
    iVar2 = (*local_30->sync)(local_38);
    if (iVar2 == 0) {
      *(undefined4 *)(local_40 + 5) = 0;
      *(undefined4 *)(local_10 + 0x6b08) = 1;
      local_8 = (aom_image_t *)0x0;
    }
    else {
      if ((int)local_40[5] == 1) {
        *(undefined4 *)(local_40 + 5) = 0;
        check_resync((aom_codec_alg_priv_t *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
      }
      iVar2 = av1_get_raw_frame((AV1Decoder *)*local_40,*local_28,&local_60,&local_68);
      if (iVar2 == 0) {
        local_70 = local_48->output_frames[*local_28];
        *(RefCntBuffer **)(local_10 + 0x1b0) = local_70;
        if (*(int *)(local_10 + 0x6b08) == 0) {
          aom_img_remove_metadata((aom_image_t *)0x18f6eb);
          yuvconfig2image((aom_image_t *)(local_10 + 0xf8),local_60,(void *)local_40[4]);
          move_decoder_metadata_to_img(local_48,(aom_image_t *)(local_10 + 0xf8));
          if ((local_48->ext_tile_debug == 0) && (local_58->large_scale != 0)) {
            *local_28 = *local_28 + 1;
            aom_img_remove_metadata((aom_image_t *)0x18f779);
            yuvconfig2image((aom_image_t *)(local_10 + 0xf8),&local_48->tile_list_outbuf,(void *)0x0
                           );
            move_decoder_metadata_to_img(local_48,(aom_image_t *)(local_10 + 0xf8));
            local_8 = (aom_image_t *)(local_10 + 0xf8);
          }
          else {
            local_74 = av1_num_planes(local_50);
            if ((local_48->ext_tile_debug != 0) &&
               ((local_58->single_tile_decoding != 0 && (-1 < local_48->dec_tile_row)))) {
              _Var1 = av1_get_uniform_tile_size(local_50,&local_78,&local_7c);
              if (!_Var1) {
                return (aom_image_t *)0x0;
              }
              if (local_48->dec_tile_row < local_58->rows + -1) {
                local_b4 = local_48->dec_tile_row;
              }
              else {
                local_b4 = local_58->rows + -1;
              }
              in_stack_ffffffffffffff7c = local_b4 * local_7c;
              in_stack_ffffffffffffff78 = *(undefined4 *)(local_10 + 0x134);
              *(long *)(local_10 + 0x138) =
                   *(long *)(local_10 + 0x138) +
                   (long)(in_stack_ffffffffffffff7c * 4 * *(int *)(local_10 + 0x150));
              if (1 < local_74) {
                for (in_stack_ffffffffffffff74 = 1; in_stack_ffffffffffffff74 < 3;
                    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
                  *(long *)(local_10 + 0x138 + (long)in_stack_ffffffffffffff74 * 8) =
                       *(long *)(local_10 + 0x138 + (long)in_stack_ffffffffffffff74 * 8) +
                       (long)(in_stack_ffffffffffffff7c *
                              (4 >> ((byte)in_stack_ffffffffffffff78 & 0x1f)) *
                             *(int *)(local_10 + 0x150 + (long)in_stack_ffffffffffffff74 * 4));
                }
              }
              if (local_7c < (local_50->mi_params).mi_rows - in_stack_ffffffffffffff7c) {
                local_b8 = local_7c;
              }
              else {
                local_b8 = (local_50->mi_params).mi_rows - in_stack_ffffffffffffff7c;
              }
              *(int *)(local_10 + 0x124) = local_b8 << 2;
            }
            if (((local_48->ext_tile_debug != 0) && (local_58->single_tile_decoding != 0)) &&
               (-1 < local_48->dec_tile_col)) {
              _Var1 = av1_get_uniform_tile_size
                                (local_50,(int *)&stack0xffffffffffffff70,
                                 (int *)&stack0xffffffffffffff6c);
              if (!_Var1) {
                return (aom_image_t *)0x0;
              }
              if (local_48->dec_tile_col < local_58->cols + -1) {
                in_stack_ffffffffffffff68 = local_48->dec_tile_col;
              }
              else {
                in_stack_ffffffffffffff68 = local_58->cols + -1;
              }
              in_stack_ffffffffffffff64 = in_stack_ffffffffffffff68 * in_stack_ffffffffffffff70;
              in_stack_ffffffffffffff60 = *(undefined4 *)(local_10 + 0x130);
              uVar3 = (uint)((*(uint *)(local_10 + 0xf8) & 0x800) != 0);
              *(long *)(local_10 + 0x138) =
                   *(long *)(local_10 + 0x138) +
                   (long)(int)(in_stack_ffffffffffffff64 * 4 * (uVar3 + 1));
              if (1 < local_74) {
                for (local_a8 = 1; local_a8 < 3; local_a8 = local_a8 + 1) {
                  *(long *)(local_10 + 0x138 + (long)local_a8 * 8) =
                       *(long *)(local_10 + 0x138 + (long)local_a8 * 8) +
                       (long)(int)(in_stack_ffffffffffffff64 *
                                   (4 >> ((byte)in_stack_ffffffffffffff60 & 0x1f)) * (uVar3 + 1));
                }
              }
              iVar2 = in_stack_ffffffffffffff70;
              if ((local_50->mi_params).mi_cols - in_stack_ffffffffffffff64 <=
                  in_stack_ffffffffffffff70) {
                iVar2 = (local_50->mi_params).mi_cols - in_stack_ffffffffffffff64;
              }
              *(int *)(local_10 + 0x120) = iVar2 << 2;
            }
            *(void **)(local_10 + 0x198) = (local_70->raw_frame_buffer).priv;
            local_20 = local_10 + 0xf8;
            *(int *)(local_10 + 0x16c) = local_70->temporal_id;
            *(int *)(local_10 + 0x170) = local_70->spatial_id;
            if (local_48->skip_film_grain != 0) {
              local_68->apply_grain = 0;
            }
            local_8 = add_grain_if_needed((aom_codec_alg_priv_t *)
                                          CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78),
                                          (aom_image_t *)
                                          CONCAT44(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70),
                                          (aom_image_t *)
                                          CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68),
                                          (aom_film_grain_t *)
                                          CONCAT44(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60));
            if (local_8 == (aom_image_t *)0x0) {
              (local_48->error).error_code = AOM_CODEC_CORRUPT_FRAME;
              (local_48->error).has_detail = 1;
              snprintf((local_48->error).detail,200,"Grain synthesis failed\n");
            }
            else {
              *local_28 = *local_28 + 1;
            }
          }
        }
        else {
          local_8 = (aom_image_t *)0x0;
        }
      }
      else {
        local_8 = (aom_image_t *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static aom_image_t *decoder_get_frame(aom_codec_alg_priv_t *ctx,
                                      aom_codec_iter_t *iter) {
  aom_image_t *img = NULL;

  if (!iter) {
    return NULL;
  }

  // To avoid having to allocate any extra storage, treat 'iter' as
  // simply a pointer to an integer index
  uintptr_t *index = (uintptr_t *)iter;

  if (ctx->frame_worker == NULL) {
    return NULL;
  }
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  AVxWorker *const worker = ctx->frame_worker;
  FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
  AV1Decoder *const pbi = frame_worker_data->pbi;
  pbi->error.error_code = AOM_CODEC_OK;
  pbi->error.has_detail = 0;
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  // Wait for the frame from worker thread.
  if (!winterface->sync(worker)) {
    // Decoding failed. Release the worker thread.
    frame_worker_data->received_frame = 0;
    ctx->need_resync = 1;
    // TODO(aomedia:3519): Set an error code. Check if a different error code
    // should be used if ctx->flushed != 1.
    return NULL;
  }
  // Check if worker has received any frames.
  if (frame_worker_data->received_frame == 1) {
    frame_worker_data->received_frame = 0;
    check_resync(ctx, frame_worker_data->pbi);
  }
  YV12_BUFFER_CONFIG *sd;
  aom_film_grain_t *grain_params;
  if (av1_get_raw_frame(frame_worker_data->pbi, *index, &sd, &grain_params) !=
      0) {
    return NULL;
  }
  RefCntBuffer *const output_frame_buf = pbi->output_frames[*index];
  ctx->last_show_frame = output_frame_buf;
  if (ctx->need_resync) return NULL;
  aom_img_remove_metadata(&ctx->img);
  yuvconfig2image(&ctx->img, sd, frame_worker_data->user_priv);
  move_decoder_metadata_to_img(pbi, &ctx->img);

  if (!pbi->ext_tile_debug && tiles->large_scale) {
    *index += 1;  // Advance the iterator to point to the next image
    aom_img_remove_metadata(&ctx->img);
    yuvconfig2image(&ctx->img, &pbi->tile_list_outbuf, NULL);
    move_decoder_metadata_to_img(pbi, &ctx->img);
    img = &ctx->img;
    return img;
  }

  const int num_planes = av1_num_planes(cm);
  if (pbi->ext_tile_debug && tiles->single_tile_decoding &&
      pbi->dec_tile_row >= 0) {
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      return NULL;
    }
    const int tile_row = AOMMIN(pbi->dec_tile_row, tiles->rows - 1);
    const int mi_row = tile_row * tile_height;
    const int ssy = ctx->img.y_chroma_shift;
    int plane;
    ctx->img.planes[0] += mi_row * MI_SIZE * ctx->img.stride[0];
    if (num_planes > 1) {
      for (plane = 1; plane < MAX_MB_PLANE; ++plane) {
        ctx->img.planes[plane] +=
            mi_row * (MI_SIZE >> ssy) * ctx->img.stride[plane];
      }
    }
    ctx->img.d_h =
        AOMMIN(tile_height, cm->mi_params.mi_rows - mi_row) * MI_SIZE;
  }

  if (pbi->ext_tile_debug && tiles->single_tile_decoding &&
      pbi->dec_tile_col >= 0) {
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      return NULL;
    }
    const int tile_col = AOMMIN(pbi->dec_tile_col, tiles->cols - 1);
    const int mi_col = tile_col * tile_width;
    const int ssx = ctx->img.x_chroma_shift;
    const int is_hbd = (ctx->img.fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 1 : 0;
    int plane;
    ctx->img.planes[0] += mi_col * MI_SIZE * (1 + is_hbd);
    if (num_planes > 1) {
      for (plane = 1; plane < MAX_MB_PLANE; ++plane) {
        ctx->img.planes[plane] += mi_col * (MI_SIZE >> ssx) * (1 + is_hbd);
      }
    }
    ctx->img.d_w = AOMMIN(tile_width, cm->mi_params.mi_cols - mi_col) * MI_SIZE;
  }

  ctx->img.fb_priv = output_frame_buf->raw_frame_buffer.priv;
  img = &ctx->img;
  img->temporal_id = output_frame_buf->temporal_id;
  img->spatial_id = output_frame_buf->spatial_id;
  if (pbi->skip_film_grain) grain_params->apply_grain = 0;
  aom_image_t *res =
      add_grain_if_needed(ctx, img, &ctx->image_with_grain, grain_params);
  if (!res) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    pbi->error.has_detail = 1;
    snprintf(pbi->error.detail, sizeof(pbi->error.detail),
             "Grain synthesis failed\n");
    return res;
  }
  *index += 1;  // Advance the iterator to point to the next image
  return res;
}